

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_cas_8_ai(void)

{
  uint address;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
    return;
  }
  uVar2 = m68ki_read_imm_16();
  address = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
  uVar3 = m68ki_read_8_fc(address,m68ki_address_space | m68ki_cpu.s_flag);
  uVar1 = m68ki_cpu.dar[uVar2 & 7];
  m68ki_cpu.n_flag = uVar3 - (uVar1 & 0xff);
  m68ki_cpu.v_flag = (m68ki_cpu.n_flag ^ uVar3) & (uVar1 ^ uVar3);
  m68ki_cpu.not_z_flag = m68ki_cpu.n_flag & 0xff;
  m68ki_cpu.c_flag = m68ki_cpu.n_flag;
  if (m68ki_cpu.not_z_flag != 0) {
    m68ki_cpu.dar[uVar2 & 7] = uVar1 & 0xffffff00 | uVar3;
    return;
  }
  m68ki_remaining_cycles = m68ki_remaining_cycles + -3;
  m68ki_write_8_fc(address,m68ki_cpu.s_flag | 1,
                   (uint)*(byte *)((long)m68ki_cpu.dar + (ulong)(uVar2 >> 4 & 0x1c)));
  return;
}

Assistant:

static void m68k_op_cas_8_ai(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		uint ea = EA_AY_AI_8();
		uint dest = m68ki_read_8(ea);
		uint* compare = &REG_D[word2 & 7];
		uint res = dest - MASK_OUT_ABOVE_8(*compare);

		m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
		FLAG_N = NFLAG_8(res);
		FLAG_Z = MASK_OUT_ABOVE_8(res);
		FLAG_V = VFLAG_SUB_8(*compare, dest, res);
		FLAG_C = CFLAG_8(res);

        if(COND_NE()) {
			*compare = MASK_OUT_BELOW_8(*compare) | dest;
        }
        else
		{
			USE_CYCLES(3);
			m68ki_write_8(ea, MASK_OUT_ABOVE_8(REG_D[(word2 >> 6) & 7]));
		}
		return;
	}
	m68ki_exception_illegal();
}